

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O0

void __thiscall PyreNet::LayerThreadPool::addJob(LayerThreadPool *this,LayerQueueJob *job)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lg;
  LayerQueueJob *job_local;
  LayerThreadPool *this_local;
  
  lg._8_8_ = job;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->queueMutex);
  std::
  queue<PyreNet::LayerThreadPool::LayerQueueJob,_std::deque<PyreNet::LayerThreadPool::LayerQueueJob,_std::allocator<PyreNet::LayerThreadPool::LayerQueueJob>_>_>
  ::push(&this->layerQueue,(value_type *)lg._8_8_);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void LayerThreadPool::addJob(const LayerThreadPool::LayerQueueJob &job) {
        std::unique_lock<std::mutex> lg(queueMutex);
        layerQueue.push(job);
        newJobCv.notify_one();
    }